

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_tRNS(ucvector *out,LodePNGColorMode *info)

{
  LodePNGColorType LVar1;
  size_t sVar2;
  uint uVar3;
  uint extraout_EAX;
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  uchar uVar10;
  uchar uVar11;
  size_t __size;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  bool bVar16;
  uchar *local_50;
  undefined2 uVar12;
  
  LVar1 = info->colortype;
  if (LVar1 == LCT_GREY) {
    if (info->key_defined == 0) goto LAB_0030e3a0;
    uVar3 = info->key_r;
    uVar13 = 1;
    local_50 = (uchar *)malloc(1);
    bVar16 = local_50 != (uchar *)0x0;
    if (bVar16) {
      uVar13 = 2;
      *local_50 = (uchar)(uVar3 >> 8);
    }
    uVar9 = (ulong)bVar16;
    uVar15 = 0;
    if ((uint)uVar13 <= (uint)bVar16 * 2) {
      uVar15 = uVar13 >> 1;
    }
    puVar4 = (uchar *)realloc(local_50,uVar15 + uVar13);
    if (puVar4 == (uchar *)0x0) goto LAB_0030e625;
    puVar5 = puVar4 + uVar13;
    uVar9 = uVar13;
LAB_0030e619:
    puVar5[-1] = (uchar)uVar3;
    local_50 = puVar4;
  }
  else {
    if (LVar1 == LCT_RGB) {
      if (info->key_defined != 0) {
        uVar3 = info->key_r;
        uVar9 = 1;
        local_50 = (uchar *)malloc(1);
        bVar16 = local_50 != (uchar *)0x0;
        if (bVar16) {
          uVar9 = 2;
          *local_50 = (uchar)(uVar3 >> 8);
        }
        uVar15 = (ulong)bVar16;
        uVar13 = 0;
        if ((uint)uVar9 <= (uint)bVar16 * 2) {
          uVar13 = uVar9 >> 1;
        }
        __size = uVar13 + uVar9;
        puVar4 = (uchar *)realloc(local_50,__size);
        if (puVar4 == (uchar *)0x0) {
          uVar6 = uVar15 + 1;
          uVar12 = (undefined2)info->key_g;
          uVar9 = uVar15;
          __size = uVar15;
LAB_0030e4a4:
          uVar11 = (uchar)uVar12;
          uVar10 = (uchar)((ushort)uVar12 >> 8);
          uVar13 = 0;
          if ((uint)uVar9 < (uint)((int)__size * 2)) {
            uVar13 = uVar6 >> 1;
          }
          puVar4 = (uchar *)realloc(local_50,uVar13 + uVar6);
          uVar15 = uVar6;
          sVar2 = uVar13 + uVar6;
          if (puVar4 != (uchar *)0x0) goto LAB_0030e4e9;
        }
        else {
          puVar4[uVar9 - 1] = (uchar)uVar3;
          uVar6 = uVar9 + 1;
          uVar12 = (undefined2)info->key_g;
          uVar10 = (uchar)(info->key_g >> 8);
          local_50 = puVar4;
          sVar2 = __size;
          if (uVar13 == 0) goto LAB_0030e4a4;
LAB_0030e4e9:
          __size = sVar2;
          puVar4[uVar6 - 1] = uVar10;
          uVar15 = uVar9 + 2;
          uVar11 = (uchar)info->key_g;
          local_50 = puVar4;
          uVar9 = uVar6;
        }
        puVar4 = local_50;
        sVar2 = __size;
        if ((uint)uVar9 < (uint)__size) {
LAB_0030e54e:
          __size = sVar2;
          puVar4[uVar15 - 1] = uVar11;
          uVar6 = uVar15 + 1;
          local_50 = puVar4;
          uVar9 = uVar15;
        }
        else {
          uVar13 = 0;
          if ((uint)uVar9 < (uint)__size * 2) {
            uVar13 = uVar15 >> 1;
          }
          puVar4 = (uchar *)realloc(local_50,uVar13 + uVar15);
          uVar6 = uVar15;
          sVar2 = uVar13 + uVar15;
          if (puVar4 != (uchar *)0x0) goto LAB_0030e54e;
        }
        uVar10 = *(uchar *)((long)&info->key_b + 1);
        uVar7 = (uint)__size;
        puVar4 = local_50;
        if ((uint)uVar9 < uVar7) {
LAB_0030e5a1:
          uVar7 = (uint)__size;
          puVar4[uVar6 - 1] = uVar10;
          uVar9 = uVar6;
          local_50 = puVar4;
          uVar6 = uVar6 + 1;
        }
        else {
          uVar13 = 0;
          if ((uint)uVar9 < uVar7 * 2) {
            uVar13 = uVar6 >> 1;
          }
          __size = uVar13 + uVar6;
          puVar4 = (uchar *)realloc(local_50,__size);
          if (puVar4 != (uchar *)0x0) goto LAB_0030e5a1;
        }
        uVar3 = info->key_b;
        puVar4 = local_50;
        if (uVar7 <= (uint)uVar9) {
          uVar13 = 0;
          if ((uint)uVar9 < uVar7 * 2) {
            uVar13 = uVar6 >> 1;
          }
          puVar4 = (uchar *)realloc(local_50,uVar13 + uVar6);
          if (puVar4 == (uchar *)0x0) goto LAB_0030e625;
        }
        puVar5 = puVar4 + uVar6;
        uVar9 = uVar6;
        goto LAB_0030e619;
      }
    }
    else {
      uVar9 = 0;
      local_50 = (uchar *)0x0;
      if (LVar1 != LCT_PALETTE) goto LAB_0030e625;
      sVar8 = info->palettesize;
      if (sVar8 != 0) {
        do {
          if (info->palette[sVar8 * 4 + -1] != 0xff) {
            sVar14 = 0;
            uVar13 = 0;
            uVar9 = 0;
            local_50 = (uchar *)0x0;
            goto LAB_0030e3c0;
          }
          sVar8 = sVar8 - 1;
        } while (sVar8 != 0);
      }
    }
LAB_0030e3a0:
    local_50 = (uchar *)0x0;
    uVar9 = 0;
  }
LAB_0030e625:
  uVar3 = lodepng_chunk_create(&out->data,&out->size,(uint)uVar9,"tRNS",local_50);
  if (uVar3 == 0) {
    out->allocsize = out->size;
  }
  free(local_50);
  return extraout_EAX;
LAB_0030e3c0:
  do {
    uVar15 = uVar9 + 1;
    uVar10 = info->palette[sVar14 * 4 + 3];
    puVar4 = local_50;
    uVar6 = uVar13;
    if (uVar13 < uVar15) {
      uVar6 = uVar15 * 3 >> 1;
      if (uVar13 * 2 < uVar15) {
        uVar6 = uVar15;
      }
      puVar4 = (uchar *)realloc(local_50,uVar6);
      if (puVar4 != (uchar *)0x0) goto LAB_0030e40f;
    }
    else {
LAB_0030e40f:
      uVar13 = uVar6;
      puVar4[uVar9] = uVar10;
      uVar9 = uVar15;
      local_50 = puVar4;
    }
    sVar14 = sVar14 + 1;
  } while (sVar8 != sVar14);
  goto LAB_0030e625;
}

Assistant:

static unsigned addChunk_tRNS(ucvector* out, const LodePNGColorMode* info)
{
  unsigned error = 0;
  size_t i;
  ucvector tRNS;
  ucvector_init(&tRNS);
  if(info->colortype == LCT_PALETTE)
  {
    size_t amount = info->palettesize;
    /*the tail of palette values that all have 255 as alpha, does not have to be encoded*/
    for(i = info->palettesize; i != 0; --i)
    {
      if(info->palette[4 * (i - 1) + 3] == 255) --amount;
      else break;
    }
    /*add only alpha channel*/
    for(i = 0; i != amount; ++i) ucvector_push_back(&tRNS, info->palette[4 * i + 3]);
  }
  else if(info->colortype == LCT_GREY)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r & 255));
    }
  }
  else if(info->colortype == LCT_RGB)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r & 255));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g & 255));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b & 255));
    }
  }

  error = addChunk(out, "tRNS", tRNS.data, tRNS.size);
  ucvector_cleanup(&tRNS);

  return error;
}